

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

string * __thiscall
TransitionObservationIndependentMADPDiscrete::SoftPrintJointActionSet_abi_cxx11_
          (TransitionObservationIndependentMADPDiscrete *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  reference ppJVar4;
  long in_RSI;
  string *in_RDI;
  const_iterator ja_last;
  const_iterator ja_it;
  stringstream ss;
  stringstream str;
  stringstream *in_stack_fffffffffffffc58;
  E *in_stack_fffffffffffffc60;
  __normal_iterator<JointActionDiscrete_*const_*,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
  *in_stack_fffffffffffffc68;
  string local_360 [32];
  JointActionDiscrete **local_340;
  __normal_iterator<JointActionDiscrete_*const_*,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
  local_338 [3];
  stringstream local_320 [16];
  ostream local_310 [376];
  stringstream local_198 [16];
  E local_188 [9];
  
  std::__cxx11::stringstream::stringstream(local_198);
  if ((*(byte *)(in_RSI + 200) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_320);
    poVar2 = std::operator<<(local_310,"TransitionObservationIndependentMADPDiscrete::PrintJoint");
    poVar2 = std::operator<<(poVar2,"ActionSets() - Error: not initialized. ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  local_338[0]._M_current =
       (JointActionDiscrete **)
       std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::begin
                 ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
                  in_stack_fffffffffffffc58);
  local_340 = (JointActionDiscrete **)
              std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::end
                        ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
                         in_stack_fffffffffffffc58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<JointActionDiscrete_*const_*,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
                        *)in_stack_fffffffffffffc60,
                       (__normal_iterator<JointActionDiscrete_*const_*,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
                        *)in_stack_fffffffffffffc58);
    if (!bVar1) break;
    in_stack_fffffffffffffc60 = local_188;
    ppJVar4 = __gnu_cxx::
              __normal_iterator<JointActionDiscrete_*const_*,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
              ::operator*(local_338);
    (*((*ppJVar4)->super_JointAction)._vptr_JointAction[3])(local_360);
    std::operator<<((ostream *)in_stack_fffffffffffffc60,local_360);
    std::__cxx11::string::~string(local_360);
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<JointActionDiscrete_*const_*,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
    ::operator++(in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string TransitionObservationIndependentMADPDiscrete::SoftPrintJointActionSet() 
    const
{
    stringstream str;
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "TransitionObservationIndependentMADPDiscrete::PrintJoint"<<
                "ActionSets() - Error: not initialized. "<<endl;
        throw E(ss);
    }   
    vector<JointActionDiscrete*>::const_iterator ja_it = 
        _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::const_iterator ja_last = 
        _m_jointActionVec.end();
    while(ja_it != ja_last)
    {
        str << (*ja_it)->SoftPrint();
        str<<endl;
        ja_it++;    
    }
    return(str.str());
}